

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::CompactReporter::printTotals(CompactReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  Colour colour_2;
  Colour colour;
  Colour colour_1;
  char local_102;
  char local_101;
  char *local_100;
  long local_f8;
  char local_f0 [16];
  char *local_e0;
  long local_d8;
  char local_d0 [16];
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  char local_b0 [8];
  char local_a8 [16];
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  char local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  sVar3 = (totals->testCases).failed + (totals->testCases).passed + (totals->testCases).failedButOk;
  if (sVar3 != 0) {
    if ((totals->testCases).failed == sVar3) {
      local_101 = '\0';
      Colour::use(BrightRed);
      sVar3 = (totals->assertions).failed;
      if ((sVar3 == (totals->assertions).passed + sVar3 + (totals->assertions).failedButOk) &&
         (sVar3 != 1)) {
        pcVar6 = "all ";
        if (sVar3 == 2) {
          pcVar6 = "both ";
        }
        local_100 = local_f0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,pcVar6,pcVar6 + (ulong)(sVar3 == 2) + 4);
      }
      else {
        local_100 = local_f0;
        local_f8 = 0;
        local_f0[0] = '\0';
      }
      poVar5 = (this->super_StreamingReporterBase).stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Failed ",7);
      sVar3 = (totals->testCases).failed;
      if (sVar3 == 1) {
        local_e0 = local_d0;
        local_d8 = 0;
        local_d0[0] = '\0';
      }
      else {
        pcVar6 = "all ";
        if (sVar3 == 2) {
          pcVar6 = "both ";
        }
        local_e0 = local_d0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,pcVar6,pcVar6 + (ulong)(sVar3 == 2) + 4);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_e0,local_d8);
      sVar3 = (totals->testCases).failed;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"test case","");
      local_98 = (undefined1  [8])sVar3;
      local_90._M_p = local_80;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_70,local_70 + local_68);
      operator<<(poVar5,(pluralise *)local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", failed ",9);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_100,local_f8);
      sVar3 = (totals->assertions).failed;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"assertion","");
      local_c0 = (undefined1  [8])sVar3;
      local_b8._M_p = local_a8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_50,local_50 + local_48);
      operator<<(poVar5,(pluralise *)local_c0);
      local_102 = '.';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_102,1);
      if (local_b8._M_p != local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (local_90._M_p != local_80) {
        operator_delete(local_90._M_p);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100);
      }
      if (local_101 == '\0') {
        Colour::use(None);
      }
    }
    else {
      sVar3 = (totals->assertions).failed;
      if ((totals->assertions).passed + sVar3 + (totals->assertions).failedButOk == 0) {
        poVar5 = (this->super_StreamingReporterBase).stream;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Passed ",7);
        lVar4 = (totals->testCases).failed + (totals->testCases).passed +
                (totals->testCases).failedButOk;
        if (lVar4 == 1) {
          local_c0 = (undefined1  [8])local_b0;
          local_b8._M_p = (pointer)0x0;
          local_b0[0] = '\0';
        }
        else {
          pcVar6 = "all ";
          if (lVar4 == 2) {
            pcVar6 = "both ";
          }
          local_c0 = (undefined1  [8])local_b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,pcVar6,pcVar6 + (ulong)(lVar4 == 2) + 4);
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_c0,(long)local_b8._M_p);
        sVar3 = (totals->testCases).passed;
        sVar1 = (totals->testCases).failed;
        sVar2 = (totals->testCases).failedButOk;
        local_100 = local_f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"test case","");
        local_98 = (undefined1  [8])(sVar1 + sVar3 + sVar2);
        local_90._M_p = local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_100,local_100 + local_f8);
        operator<<(poVar5,(pluralise *)local_98);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," (no assertions).",0x11);
        if (local_90._M_p != local_80) {
          operator_delete(local_90._M_p);
        }
        if (local_100 != local_f0) {
          operator_delete(local_100);
        }
        if (local_c0 != (undefined1  [8])local_b0) {
          operator_delete((void *)local_c0);
        }
      }
      else if (sVar3 == 0) {
        local_102 = '\0';
        Colour::use(BrightGreen);
        poVar5 = (this->super_StreamingReporterBase).stream;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Passed ",7);
        sVar3 = (totals->testCases).passed;
        if (sVar3 == 1) {
          local_100 = local_f0;
          local_f8 = 0;
          local_f0[0] = '\0';
        }
        else {
          pcVar6 = "all ";
          if (sVar3 == 2) {
            pcVar6 = "both ";
          }
          local_100 = local_f0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_100,pcVar6,pcVar6 + (ulong)(sVar3 == 2) + 4);
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_100,local_f8);
        sVar3 = (totals->testCases).passed;
        local_e0 = local_d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"test case","");
        local_98 = (undefined1  [8])sVar3;
        local_90._M_p = local_80;
        std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_e0,local_e0 + local_d8);
        operator<<(poVar5,(pluralise *)local_98);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," with ",6);
        sVar3 = (totals->assertions).passed;
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"assertion","");
        local_c0 = (undefined1  [8])sVar3;
        local_b8._M_p = local_a8;
        std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_70,local_70 + local_68);
        operator<<(poVar5,(pluralise *)local_c0);
        local_50 = (undefined1 *)CONCAT71(local_50._1_7_,0x2e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_50,1);
        if (local_b8._M_p != local_a8) {
          operator_delete(local_b8._M_p);
        }
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        if (local_90._M_p != local_80) {
          operator_delete(local_90._M_p);
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0);
        }
        if (local_100 != local_f0) {
          operator_delete(local_100);
        }
        if (local_102 == '\0') {
          Colour::use(None);
        }
      }
      else {
        local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
        Colour::use(BrightRed);
        poVar5 = (this->super_StreamingReporterBase).stream;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Failed ",7);
        sVar3 = (totals->testCases).failed;
        local_100 = local_f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"test case","");
        local_98 = (undefined1  [8])sVar3;
        local_90._M_p = local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_100,local_100 + local_f8);
        operator<<(poVar5,(pluralise *)local_98);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", failed ",9);
        sVar3 = (totals->assertions).failed;
        local_e0 = local_d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"assertion","");
        local_c0 = (undefined1  [8])sVar3;
        local_b8._M_p = local_a8;
        std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_e0,local_e0 + local_d8);
        operator<<(poVar5,(pluralise *)local_c0);
        local_70 = (undefined1 *)CONCAT71(local_70._1_7_,0x2e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_70,1);
        if (local_b8._M_p != local_a8) {
          operator_delete(local_b8._M_p);
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0);
        }
        if (local_90._M_p != local_80) {
          operator_delete(local_90._M_p);
        }
        if (local_100 != local_f0) {
          operator_delete(local_100);
        }
        Colour::use(None);
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).stream,"No tests ran.",0xd);
  return;
}

Assistant:

void printTotals( const Totals& totals ) const {
            if( totals.testCases.total() == 0 ) {
                stream << "No tests ran.";
            }
            else if( totals.testCases.failed == totals.testCases.total() ) {
                Colour colour( Colour::ResultError );
                const std::string qualify_assertions_failed =
                    totals.assertions.failed == totals.assertions.total() ?
                        bothOrAll( totals.assertions.failed ) : std::string();
                stream <<
                    "Failed " << bothOrAll( totals.testCases.failed )
                              << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << qualify_assertions_failed <<
                                 pluralise( totals.assertions.failed, "assertion" ) << '.';
            }
            else if( totals.assertions.total() == 0 ) {
                stream <<
                    "Passed " << bothOrAll( totals.testCases.total() )
                              << pluralise( totals.testCases.total(), "test case" )
                              << " (no assertions).";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                stream <<
                    "Failed " << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << pluralise( totals.assertions.failed, "assertion" ) << '.';
            }
            else {
                Colour colour( Colour::ResultSuccess );
                stream <<
                    "Passed " << bothOrAll( totals.testCases.passed )
                              << pluralise( totals.testCases.passed, "test case"  ) <<
                    " with "  << pluralise( totals.assertions.passed, "assertion" ) << '.';
            }
        }